

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O0

base_learner * boosting_setup(options_i *options,vw *all)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pbVar4;
  void *pvVar5;
  undefined8 uVar6;
  vw *in_RSI;
  long *in_RDI;
  stringstream __msg;
  learner<boosting,_example> *l;
  option_group_definition new_options;
  free_ptr<boosting> data;
  string *in_stack_fffffffffffff838;
  vw *in_stack_fffffffffffff840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff848;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff850;
  string *in_stack_fffffffffffff858;
  learner<boosting,_example> *in_stack_fffffffffffff860;
  int plineNumber;
  char *in_stack_fffffffffffff868;
  vw_exception *in_stack_fffffffffffff870;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff888;
  option_group_definition *in_stack_fffffffffffff890;
  allocator *l_00;
  stringstream local_5c8 [16];
  ostream local_5b8;
  learner<boosting,_example> *local_440;
  undefined4 local_434;
  undefined4 local_414;
  undefined8 local_3f0;
  undefined4 local_3b8;
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [199];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  typed_option<int> local_138;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  string local_28;
  base_learner *local_8;
  
  local_28.field_2._M_allocated_capacity = (size_type)in_RSI;
  local_28.field_2._8_8_ = in_RDI;
  scoped_calloc_or_throw<boosting>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Boosting",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  l_00 = &local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"boosting",l_00);
  std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
            ((unique_ptr<boosting,_void_(*)(void_*)> *)0x414978);
  VW::config::make_option<int>(in_stack_fffffffffffff848,(int *)in_stack_fffffffffffff840);
  VW::config::typed_option<int>::keep(&local_138,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"Online boosting with <N> weak learners",&local_181);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            (in_stack_fffffffffffff890,(typed_option<int> *)in_stack_fffffffffffff888);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"gamma",&local_249);
  std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
            ((unique_ptr<boosting,_void_(*)(void_*)> *)0x414a5f);
  VW::config::make_option<float>(in_stack_fffffffffffff848,(float *)in_stack_fffffffffffff840);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)in_stack_fffffffffffff850,
             (float)((ulong)in_stack_fffffffffffff848 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_270,"weak learner\'s edge (=0.1), used only by online BBM",&local_271);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff890,(typed_option<float> *)in_stack_fffffffffffff888);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"alg",&local_339);
  std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
            ((unique_ptr<boosting,_void_(*)(void_*)> *)0x414b4d);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff848,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff840);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_318,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"BBM",&local_361);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  default_value(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_388,
             "specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"
             ,&local_389);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff840);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff840);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff840);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  (*(code *)**(undefined8 **)local_28.field_2._8_8_)(local_28.field_2._8_8_,local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"boosting",&local_3b1);
  bVar1 = (**(code **)(*(long *)local_28.field_2._8_8_ + 8))(local_28.field_2._8_8_,local_3b0);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    if ((*(bool *)(local_28.field_2._M_allocated_capacity + 0x3439) & 1U) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Number of weak learners = ");
      pbVar4 = std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                         ((unique_ptr<boosting,_void_(*)(void_*)> *)0x415157);
      pvVar5 = (void *)std::ostream::operator<<(poVar3,pbVar4->N);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    if ((*(bool *)(local_28.field_2._M_allocated_capacity + 0x3439) & 1U) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Gamma = ");
      pbVar4 = std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                         ((unique_ptr<boosting,_void_(*)(void_*)> *)0x4151c3);
      pvVar5 = (void *)std::ostream::operator<<(poVar3,pbVar4->gamma);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x41520c);
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x415224);
    local_3f0 = 0xffffffffffffffff;
    std::allocator<long>::allocator((allocator<long> *)0x415250);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffff860,
               (size_type)in_stack_fffffffffffff858,
               (value_type_conflict6 *)in_stack_fffffffffffff850,
               (allocator_type *)in_stack_fffffffffffff848);
    std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator
              ((allocator<std::vector<long,_std::allocator<long>_>_> *)0x41528c);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              *)in_stack_fffffffffffff860,(size_type)in_stack_fffffffffffff858,
             (value_type *)in_stack_fffffffffffff850,(allocator_type *)in_stack_fffffffffffff848);
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x4152c8);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::operator=((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)in_stack_fffffffffffff850,
                (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)in_stack_fffffffffffff848);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)in_stack_fffffffffffff850);
    std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator
              ((allocator<std::vector<long,_std::allocator<long>_>_> *)0x4152fe);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffff850);
    std::allocator<long>::~allocator((allocator<long> *)0x415318);
    pbVar4 = std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                       ((unique_ptr<boosting,_void_(*)(void_*)> *)0x415325);
    pbVar4->t = 0;
    pbVar4 = std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                       ((unique_ptr<boosting,_void_(*)(void_*)> *)0x415349);
    pbVar4->all = (vw *)local_28.field_2._M_allocated_capacity;
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x415362);
    local_414 = 0;
    std::allocator<float>::allocator((allocator<float> *)0x41538d);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff860,
               (size_type)in_stack_fffffffffffff858,
               (value_type_conflict2 *)in_stack_fffffffffffff850,
               (allocator_type *)in_stack_fffffffffffff848);
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x4153c9);
    std::vector<float,_std::allocator<float>_>::operator=
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff850,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff848);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff850);
    std::allocator<float>::~allocator((allocator<float> *)0x4153ff);
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x41540c);
    local_434 = 0x3f800000;
    std::allocator<float>::allocator((allocator<float> *)0x415437);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff860,
               (size_type)in_stack_fffffffffffff858,
               (value_type_conflict2 *)in_stack_fffffffffffff850,
               (allocator_type *)in_stack_fffffffffffff848);
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x415473);
    std::vector<float,_std::allocator<float>_>::operator=
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff850,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff848);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff850);
    std::allocator<float>::~allocator((allocator<float> *)0x4154a9);
    std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
              ((unique_ptr<boosting,_void_(*)(void_*)> *)0x4154b6);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838);
    if (bVar2) {
      setup_base((options_i *)in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
      std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                ((unique_ptr<boosting,_void_(*)(void_*)> *)0x41552a);
      local_440 = LEARNER::init_learner<boosting,example,LEARNER::learner<char,example>>
                            ((free_ptr<boosting> *)in_stack_fffffffffffff860,
                             (learner<char,_example> *)in_stack_fffffffffffff858,
                             (_func_void_boosting_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff850,
                             (_func_void_boosting_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffff848,(size_t)in_stack_fffffffffffff840);
    }
    else {
      std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                ((unique_ptr<boosting,_void_(*)(void_*)> *)0x415615);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838);
      if (bVar2) {
        setup_base((options_i *)in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
        std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                  ((unique_ptr<boosting,_void_(*)(void_*)> *)0x41567a);
        local_440 = LEARNER::init_learner<boosting,example,LEARNER::learner<char,example>>
                              ((free_ptr<boosting> *)in_stack_fffffffffffff860,
                               (learner<char,_example> *)in_stack_fffffffffffff858,
                               (_func_void_boosting_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff850,
                               (_func_void_boosting_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff848,(size_t)in_stack_fffffffffffff840);
        LEARNER::learner<boosting,_example>::set_save_load(local_440,save_load);
      }
      else {
        std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                  ((unique_ptr<boosting,_void_(*)(void_*)> *)0x4156d6);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838);
        if (!bVar2) {
          std::__cxx11::stringstream::stringstream(local_5c8);
          plineNumber = (int)((ulong)in_stack_fffffffffffff860 >> 0x20);
          poVar3 = std::operator<<(&local_5b8,"Unrecognized boosting algorithm: \'");
          pbVar4 = std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                             ((unique_ptr<boosting,_void_(*)(void_*)> *)0x4157c1);
          poVar3 = std::operator<<(poVar3,(string *)&pbVar4->alg);
          std::operator<<(poVar3,"\' Bailing!");
          uVar6 = __cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          VW::vw_exception::vw_exception
                    (in_stack_fffffffffffff870,in_stack_fffffffffffff868,plineNumber,
                     in_stack_fffffffffffff858);
          __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        setup_base((options_i *)in_stack_fffffffffffff848,in_stack_fffffffffffff840);
        LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
        in_stack_fffffffffffff858 = &local_28;
        std::unique_ptr<boosting,_void_(*)(void_*)>::operator->
                  ((unique_ptr<boosting,_void_(*)(void_*)> *)0x41573b);
        in_stack_fffffffffffff860 =
             LEARNER::init_learner<boosting,example,LEARNER::learner<char,example>>
                       ((free_ptr<boosting> *)in_stack_fffffffffffff860,
                        (learner<char,_example> *)in_stack_fffffffffffff858,
                        (_func_void_boosting_ptr_learner<char,_example>_ptr_example_ptr *)
                        in_stack_fffffffffffff850,
                        (_func_void_boosting_ptr_learner<char,_example>_ptr_example_ptr *)
                        in_stack_fffffffffffff848,(size_t)in_stack_fffffffffffff840);
        local_440 = in_stack_fffffffffffff860;
        LEARNER::learner<boosting,_example>::set_save_load
                  (in_stack_fffffffffffff860,save_load_sampling);
      }
    }
    LEARNER::learner<boosting,_example>::set_finish
              (in_stack_fffffffffffff860,(_func_void_boosting_ptr *)in_stack_fffffffffffff858);
    LEARNER::learner<boosting,_example>::set_finish_example(local_440,return_example);
    local_8 = LEARNER::make_base<boosting,example>(local_440);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  local_3b8 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff840);
  std::unique_ptr<boosting,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<boosting,_void_(*)(void_*)> *)in_stack_fffffffffffff850);
  return local_8;
}

Assistant:

LEARNER::base_learner* boosting_setup(options_i& options, vw& all)
{
  free_ptr<boosting> data = scoped_calloc_or_throw<boosting>();
  option_group_definition new_options("Boosting");
  new_options.add(make_option("boosting", data->N).keep().help("Online boosting with <N> weak learners"))
      .add(make_option("gamma", data->gamma)
               .default_value(0.1f)
               .help("weak learner's edge (=0.1), used only by online BBM"))
      .add(
          make_option("alg", data->alg)
              .keep()
              .default_value("BBM")
              .help("specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("boosting"))
    return nullptr;

  // Description of options:
  // "BBM" implements online BBM (Algorithm 1 in BLK'15)
  // "logistic" implements AdaBoost.OL.W (importance weighted version
  // 	    of Algorithm 2 in BLK'15)
  // "adaptive" implements AdaBoost.OL (Algorithm 2 in BLK'15,
  // 	    using sampling rather than importance weighting)

  if (!all.quiet)
    cerr << "Number of weak learners = " << data->N << endl;
  if (!all.quiet)
    cerr << "Gamma = " << data->gamma << endl;

  data->C = std::vector<std::vector<int64_t> >(data->N, std::vector<int64_t>(data->N, -1));
  data->t = 0;
  data->all = &all;
  data->alpha = std::vector<float>(data->N, 0);
  data->v = std::vector<float>(data->N, 1);

  learner<boosting, example>* l;
  if (data->alg == "BBM")
    l = &init_learner<boosting, example>(
        data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->N);
  else if (data->alg == "logistic")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_logistic<true>,
        predict_or_learn_logistic<false>, data->N);
    l->set_save_load(save_load);
  }
  else if (data->alg == "adaptive")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_adaptive<true>,
        predict_or_learn_adaptive<false>, data->N);
    l->set_save_load(save_load_sampling);
  }
  else
    THROW("Unrecognized boosting algorithm: \'" << data->alg << "\' Bailing!");

  l->set_finish(finish);
  l->set_finish_example(return_example);

  return make_base(*l);
}